

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall
Assimp::HMPImporter::ReadFirstSkin
          (HMPImporter *this,uint iNumSkins,uchar *szCursor,uchar **szCursorOut)

{
  uint iWidth_00;
  uint iHeight_00;
  DeadlyImportError *this_00;
  aiMaterial *this_01;
  uint *puVar1;
  uchar **ppuVar2;
  aiMaterial **ppaVar3;
  uint local_7c;
  uint i;
  aiMaterial *pcMat;
  uint32_t iHeight;
  uint32_t iWidth;
  allocator local_51;
  string local_50;
  uint local_2c;
  uchar **ppuStack_28;
  uint32_t iType;
  uchar **szCursorOut_local;
  uchar *szCursor_local;
  HMPImporter *pHStack_10;
  uint iNumSkins_local;
  HMPImporter *this_local;
  
  ppuStack_28 = szCursorOut;
  szCursorOut_local = (uchar **)szCursor;
  szCursor_local._4_4_ = iNumSkins;
  pHStack_10 = this;
  if (iNumSkins == 0) {
    __assert_fail("0 != iNumSkins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/HMP/HMPLoader.cpp"
                  ,0x1c6,
                  "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCursor == (uchar *)0x0) {
    __assert_fail("nullptr != szCursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/HMP/HMPLoader.cpp"
                  ,0x1c7,
                  "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
                 );
  }
  local_2c = *(uint *)szCursor;
  szCursorOut_local = (uchar **)(szCursor + 4);
  if (local_2c == 0) {
    local_2c = *(uint *)(szCursor + 0xc);
    szCursorOut_local = (uchar **)(szCursor + 0x10);
    if (local_2c == 0) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,"Unable to read HMP7 skin chunk",&local_51);
      DeadlyImportError::DeadlyImportError(this_00,&local_50);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  iWidth_00 = *(uint *)szCursorOut_local;
  iHeight_00 = *(uint *)((long)szCursorOut_local + 4);
  szCursorOut_local = szCursorOut_local + 1;
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  MDLImporter::ParseSkinLump_3DGS_MDL7
            (&this->super_MDLImporter,(uchar *)szCursorOut_local,(uchar **)&szCursorOut_local,
             this_01,local_2c,iWidth_00,iHeight_00);
  for (local_7c = 1; local_7c < szCursor_local._4_4_; local_7c = local_7c + 1) {
    local_2c = *(uint *)szCursorOut_local;
    puVar1 = (uint *)((long)szCursorOut_local + 4);
    ppuVar2 = szCursorOut_local + 1;
    szCursorOut_local = (uchar **)((long)szCursorOut_local + 0xc);
    MDLImporter::SkipSkinLump_3DGS_MDL7
              (&this->super_MDLImporter,(uchar *)szCursorOut_local,(uchar **)&szCursorOut_local,
               local_2c,*puVar1,*(uint *)ppuVar2);
    MDLImporter::SizeCheck(&this->super_MDLImporter,szCursorOut_local);
  }
  ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
  ppaVar3 = (aiMaterial **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMaterials = ppaVar3;
  *((this->super_MDLImporter).pScene)->mMaterials = this_01;
  *ppuStack_28 = (uchar *)szCursorOut_local;
  return;
}

Assistant:

void HMPImporter::ReadFirstSkin(unsigned int iNumSkins, const unsigned char* szCursor,
    const unsigned char** szCursorOut)
{
    ai_assert( 0 != iNumSkins );
    ai_assert( nullptr != szCursor);

    // read the type of the skin ...
    // sometimes we need to skip 12 bytes here, I don't know why ...
    uint32_t iType = *((uint32_t*)szCursor);
    szCursor += sizeof(uint32_t);
    if (0 == iType)
    {
        szCursor += sizeof(uint32_t) * 2;
        iType = *((uint32_t*)szCursor);
        szCursor += sizeof(uint32_t);
        if (!iType)
            throw DeadlyImportError("Unable to read HMP7 skin chunk");

    }
    // read width and height
    uint32_t iWidth  = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);
    uint32_t iHeight = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);

    // allocate an output material
    aiMaterial* pcMat = new aiMaterial();

    // read the skin, this works exactly as for MDL7
    ParseSkinLump_3DGS_MDL7(szCursor,&szCursor,
        pcMat,iType,iWidth,iHeight);

    // now we need to skip any other skins ...
    for (unsigned int i = 1; i< iNumSkins;++i)
    {
        iType   = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iWidth  = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iHeight = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);

        SkipSkinLump_3DGS_MDL7(szCursor,&szCursor,iType,iWidth,iHeight);
        SizeCheck(szCursor);
    }

    // setup the material ...
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    *szCursorOut = szCursor;
}